

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

sqlid_t hiberlite::Database::allocId(shared_connection *c,string *table)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  sqlite3_int64 sVar4;
  runtime_error *prVar5;
  char *pcVar6;
  long *plVar7;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar8;
  char *err_msg;
  string query;
  char *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_a8 = (char *)0x0;
  std::operator+(&local_40,"INSERT INTO ",table);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_70 = *plVar7;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar7;
    local_80 = (long *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_50 = *plVar7;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar7;
    local_60 = (long *)*plVar3;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_90 = *plVar7;
    lStack_88 = plVar3[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar7;
    local_a0 = (long *)*plVar3;
  }
  local_98 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  iVar2 = sqlite3_exec(c->res->res->con,(char *)local_a0,(sqlite3_callback)0x0,(void *)0x0,&local_a8
                      );
  if (local_a8 == (char *)0x0) {
    psVar8 = c->res;
    if (psVar8 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      iVar1 = psVar8->refCount;
      psVar8->refCount = iVar1 + 1;
      if (iVar2 == 0) {
        psVar8->refCount = iVar1;
        if (iVar1 == 0) {
          (*psVar8->_vptr_shared_cnt_obj_pair[1])(psVar8);
          psVar8 = c->res;
        }
        sVar4 = sqlite3_last_insert_rowid(psVar8->res->con);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        return sVar4;
      }
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar6 = sqlite3_errmsg(psVar8->res->con);
    std::runtime_error::runtime_error(prVar5,pcVar6);
    *(undefined ***)prVar5 = &PTR__runtime_error_001d36a8;
    __cxa_throw(prVar5,&database_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,local_a8);
  *(undefined ***)prVar5 = &PTR__runtime_error_001d36a8;
  __cxa_throw(prVar5,&database_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

sqlid_t Database::allocId(shared_connection c, std::string table)
{
	//THREAD critical call
	char* err_msg=NULL;
	std::string query="INSERT INTO "+table+" ("+HIBERLITE_PRIMARY_KEY_COLUMN+") VALUES (NULL);";
	HIBERLITE_HL_DBG_DO( std::cout << "exec: " << query << std::endl; )
	int rc=sqlite3_exec(c->getSQLite3Ptr(),query.c_str(),NULL, NULL, &err_msg );
	if(err_msg)
		throw database_error(err_msg);
	database_error::database_assert(rc, c);

	return sqlite3_last_insert_rowid(c->getSQLite3Ptr());
}